

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::StrAppend(string *result,AlphaNum *a)

{
  AlphaNum *pAVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  LogMessage *other;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  AlphaNum *local_18;
  AlphaNum *a_local;
  string *result_local;
  
  local_18 = a;
  a_local = (AlphaNum *)result;
  pcVar2 = strings::AlphaNum::data(a);
  lVar3 = std::__cxx11::string::data();
  uVar4 = std::__cxx11::string::size();
  local_51 = 0;
  if ((ulong)((long)pcVar2 - lVar3) <= uVar4) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x62a);
    local_51 = 1;
    other = internal::LogMessage::operator<<
                      (&local_50,
                       "CHECK failed: (uintptr_t((a).data() - (*result).data())) > (uintptr_t((*result).size())): "
                      );
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  pAVar1 = a_local;
  pcVar2 = strings::AlphaNum::data(local_18);
  strings::AlphaNum::size(local_18);
  std::__cxx11::string::append((char *)pAVar1,(ulong)pcVar2);
  return;
}

Assistant:

void StrAppend(string *result, const AlphaNum &a) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  result->append(a.data(), a.size());
}